

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_ClearOptionalMessageField_Test::
~Proto3OptionalTest_ClearOptionalMessageField_Test
          (Proto3OptionalTest_ClearOptionalMessageField_Test *this)

{
  Proto3OptionalTest_ClearOptionalMessageField_Test *this_local;
  
  ~Proto3OptionalTest_ClearOptionalMessageField_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Proto3OptionalTest, ClearOptionalMessageField) {
  proto2_unittest::TestProto3OptionalMessage msg;
  msg.mutable_optional_nested_message();
  const google::protobuf::Descriptor* d = msg.GetDescriptor();
  const google::protobuf::Reflection* r = msg.GetReflection();
  const google::protobuf::FieldDescriptor* f =
      d->FindFieldByName("optional_nested_message");
  r->ClearField(&msg, f);
}